

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_save(t_gobj *z,_binbuf *b)

{
  _array *p_Var1;
  t_symbol *ptVar2;
  t_template *x;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  char *fmt;
  uint uVar8;
  int iVar9;
  t_float tVar10;
  
  p_Var1 = garray_getarray((_garray *)z);
  ptVar3 = (z[1].g_pd)->c_externdir;
  ptVar2 = gensym("pd-float-array");
  ptVar4 = (z[1].g_pd)->c_externdir;
  if (ptVar3 == ptVar2) {
    x = template_findbyname(ptVar4);
    if (x != (t_template *)0x0) {
      ptVar3 = gensym("style");
      tVar10 = template_getfloat(x,ptVar3,(t_word *)&(z[1].g_pd)->c_size,0);
      iVar9 = (int)tVar10;
      uVar7 = iVar9 * 2;
      if (iVar9 == 1) {
        uVar7 = 0;
      }
      ptVar3 = gensym("#X");
      ptVar4 = gensym("array");
      uVar8 = (uint)(*(byte *)&z[3].g_pd >> 1);
      uVar5 = 2;
      if (iVar9 != 0) {
        uVar5 = uVar7;
      }
      binbuf_addv(b,"sssisi;",ptVar3,ptVar4,z[2].g_pd,(ulong)(uint)p_Var1->a_n,&s_float,
                  (ulong)((uVar8 & 8) + (uVar5 | uVar8 & 1)));
      garray_savecontentsto((_garray *)z,b);
      return;
    }
    pcVar6 = (z[1].g_pd)->c_externdir->s_name;
    fmt = "array: no template of type %s";
    z = (t_gobj *)0x0;
  }
  else {
    pcVar6 = ptVar4->s_name;
    fmt = "can\'t save arrays of type %s yet";
  }
  pd_error(z,fmt,pcVar6);
  return;
}

Assistant:

static void garray_save(t_gobj *z, t_binbuf *b)
{
    int style, filestyle;
    t_garray *x = (t_garray *)z;
    t_array *array = garray_getarray(x);
    t_template *scalartemplate;
    if (x->x_scalar->sc_template != gensym("pd-float-array"))
    {
            /* LATER "save" the scalar as such */
        pd_error(x, "can't save arrays of type %s yet",
            x->x_scalar->sc_template->s_name);
        return;
    }
    if (!(scalartemplate = template_findbyname(x->x_scalar->sc_template)))
    {
        pd_error(0, "array: no template of type %s",
            x->x_scalar->sc_template->s_name);
        return;
    }
    style = template_getfloat(scalartemplate, gensym("style"),
            x->x_scalar->sc_vec, 0);
    filestyle = (style == PLOTSTYLE_POINTS ? 1 :
        (style == PLOTSTYLE_POLY ? 0 : style));
    binbuf_addv(b, "sssisi;", gensym("#X"), gensym("array"),
        x->x_name, array->a_n, &s_float,
            x->x_saveit + 2 * filestyle + 8*x->x_hidename);
    garray_savecontentsto(x, b);
}